

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_All2allvUnknownSize_Test::TestBody(MxxColl_All2allvUnknownSize_Test *this)

{
  ulong uVar1;
  pointer puVar2;
  int iVar3;
  char *pcVar4;
  int i;
  long lVar5;
  size_t j;
  ulong uVar6;
  pointer pcVar7;
  char cVar8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  AssertHelper local_e8;
  AssertionResult gtest_ar;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  comm c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> actual_recv_count;
  vector<char,_std::allocator<char>_> result;
  vector<char,_std::allocator<char>_> msgs;
  size_t recv_size;
  
  mxx::comm::comm(&c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&send_counts,(long)c.m_size,(allocator_type *)&gtest_ar);
  msgs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  msgs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  msgs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  cVar8 = 'A';
  for (lVar5 = 0; lVar5 < c.m_size; lVar5 = lVar5 + 1) {
    uVar1 = (ulong)((c.m_rank + (int)lVar5) % c.m_size + 3);
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = uVar1;
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
      gtest_ar.success_ = (bool)(cVar8 + (char)uVar6 + (char)c.m_rank);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&msgs,&gtest_ar.success_);
      uVar1 = send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
    }
    cVar8 = cVar8 + '\x01';
  }
  mxx::all2allv<char>(&result,msgs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,&send_counts,&c);
  mxx::comm::comm((comm *)&gtest_ar);
  mxx::all2all<unsigned_long>(&actual_recv_count,&send_counts,(comm *)&gtest_ar);
  mxx::comm::~comm((comm *)&gtest_ar);
  iVar3 = 0;
  for (puVar2 = actual_recv_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != actual_recv_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    iVar3 = iVar3 + (int)*puVar2;
  }
  recv_size = (size_t)iVar3;
  local_f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish +
       -(long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"recv_size","result.size()",&recv_size,(unsigned_long *)&local_f0
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x296,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f0);
LAB_00131913:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cVar8 = 'A';
    pcVar7 = result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar5 = 0; lVar5 < c.m_size; lVar5 = lVar5 + 1) {
      for (uVar1 = 0;
          uVar1 < actual_recv_count.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5]; uVar1 = uVar1 + 1) {
        local_f0.ptr_._0_1_ = (char)uVar1 + cVar8 + (char)c.m_rank;
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)&gtest_ar,"(char)(\'A\'+i+c.rank()+j)","*it",(char *)&local_f0,
                   pcVar7 + uVar1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_f0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x29a,pcVar4);
          testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
          testing::internal::AssertHelper::~AssertHelper(&local_e8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_f0);
          goto LAB_00131913;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      cVar8 = cVar8 + '\x01';
      pcVar7 = pcVar7 + uVar1;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&actual_recv_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&result.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&msgs.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxColl, All2allvUnknownSize) {
    mxx::comm c;

    std::vector<size_t> send_counts(c.size());
    std::vector<char> msgs;
    for (int i = 0; i < c.size(); ++i) {
        send_counts[i] = (i + c.rank()) % c.size() + 3;
        for (size_t j = 0; j < send_counts[i]; ++j) {
            msgs.push_back('A'+i+j+c.rank());
        }
    }

    // send without knowing the receive count
    std::vector<char> result = mxx::all2allv(msgs, send_counts, c);

    // get the expected receive counts
    std::vector<size_t> actual_recv_count = mxx::all2all(send_counts);
    size_t recv_size = std::accumulate(actual_recv_count.begin(), actual_recv_count.end(), 0);

    ASSERT_EQ(recv_size, result.size());
    std::vector<char>::iterator it = result.begin();
    for (int i = 0; i < c.size(); ++i) {
        for (size_t j = 0; j < actual_recv_count[i]; ++j) {
            ASSERT_EQ((char)('A'+i+c.rank()+j), *it);
            it++;
        }
    }
}